

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererTests::RendererAdapterShiftsPixelsCoordinatesAccordinglyToTheOffset
          (RendererTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *__s;
  uint length;
  uint8_t covers [5];
  blender<int,_unsigned_char> blender;
  int reference1 [35];
  cover_type local_1c0 [8];
  vector<int,_std::allocator<int>_> local_1b8;
  ulong local_1a0;
  blender<int,_unsigned_char> local_198;
  LocationInfo local_180;
  string local_158;
  LocationInfo local_138;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined4 uStack_c0;
  undefined4 local_bc;
  undefined4 uStack_b8;
  undefined8 uStack_b4;
  int local_a8 [36];
  
  local_1c0[4] = 0x79;
  local_1c0[0] = '\x10';
  local_1c0[1] = '\x19';
  local_1c0[2] = 0xf7;
  local_1c0[3] = 0xe3;
  local_198.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (int *)operator_new(0x8c);
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       __s;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x23;
  memset(__s,0,0x8c);
  local_1a0 = 0x500000007;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = __s + 0x23;
  mocks::blender<int,_unsigned_char>::operator()(&local_198,__s + 8,-2,-1,3,local_1c0);
  mocks::blender<int,_unsigned_char>::operator()
            (&local_198,
             local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start + (local_1a0 & 0xffffffff) * 3 + 3,0,1,2,local_1c0);
  mocks::blender<int,_unsigned_char>::operator()
            (&local_198,
             local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start + (local_1a0 & 0xffffffff) * 4 + 4,1,2,3,local_1c0);
  memcpy(local_a8,&DAT_001a1b00,0x8c);
  paVar1 = &local_180.filename.field_2;
  local_180.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_180.filename,0x2ec);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
            ((int (*) [35])local_a8,&local_1b8,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_138.filename._M_dataplus._M_p._4_4_,
                  local_138.filename._M_dataplus._M_p._0_4_) != &local_138.filename.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_138.filename._M_dataplus._M_p._4_4_,
                             local_138.filename._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_180.filename._M_dataplus._M_p);
  }
  local_138.filename._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&local_1b8,
             (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_138);
  if (0 < (int)(uint)local_1a0) {
    length = 4;
    if ((uint)local_1a0 < 4) {
      length = (uint)local_1a0;
    }
    mocks::blender<int,_unsigned_char>::operator()
              (&local_198,
               local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,0x50,0x30,length,local_1c0);
  }
  uStack_b8 = 0;
  uStack_b4 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  local_bc = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_138.line = 0;
  local_138._36_4_ = 0;
  uStack_110 = 0;
  local_138.filename.field_2._M_allocated_capacity = 0;
  local_138.filename.field_2._8_8_ = 0;
  local_138.filename._M_dataplus._M_p._0_4_ = 0x305010;
  local_138.filename._M_dataplus._M_p._4_4_ = 0x305019;
  local_138.filename._M_string_length._0_4_ = 0x3050f7;
  local_138.filename._M_string_length._4_4_ = 0x3050e3;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_180,&local_158,0x301);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
            ((int (*) [35])&local_138,&local_1b8,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_180.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.filling_log.
      super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.filling_log.
                    super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( RendererAdapterShiftsPixelsCoordinatesAccordinglyToTheOffset )
			{
				// INIT
				uint8_t covers[] = { 0x10, 0x19, 0xF7, 0xE3, 0x79, };
				mocks::blender<int, uint8_t> blender;
				mocks::bitmap<int> bitmap(7, 5);

				typedef renderer::adapter< mocks::bitmap<int>, mocks::blender<int, uint8_t> > renderer_adapter;

				// INIT / ACT
				renderer_adapter r1(bitmap, mkvector(-3, -2), 0, blender);

				// ACT
				r1.set_y(-1);
				r1(-2, 3, covers);
				
				r1.set_y(1);
				r1(0, 2, covers);
				
				r1.set_y(2);
				r1(1, 3, covers);

				// ASSERT
				int reference1[] = {
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00FFFE10, 0x00FFFE19, 0x00FFFEF7, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00010010, 0x00010019, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00020110, 0x00020119, 0x000201F7,
				};

				assert_equal(reference1, bitmap.data);

				// INIT
				bitmap.data.assign(bitmap.data.size(), 0);

				// INIT / ACT
				renderer_adapter r2(bitmap, mkvector(0x50, 0x30), 0, blender);

				// ACT
				r2.set_y(0x30);
				r2(0x50, 4, covers);

				// ASSERT
				int reference2[] = {
					0x00305010, 0x00305019, 0x003050F7, 0x003050E3, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
				};

				assert_equal(reference2, bitmap.data);
			}